

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O1

GLchar * gl4cts::ConditionalRenderInverted::Utilities::queryTargetToChars(GLenum mode)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "unknow mode";
  if (mode == 0x8914) {
    pcVar2 = "GL_SAMPLES_PASSED";
  }
  pcVar1 = "GL_ANY_SAMPLES_PASSED";
  if (mode != 0x8c2f) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const glw::GLchar* gl4cts::ConditionalRenderInverted::Utilities::queryTargetToChars(glw::GLenum mode)
{
	/* Const name values. */
	static const glw::GLchar* any_samples_name	= "GL_ANY_SAMPLES_PASSED";
	static const glw::GLchar* samples_name		  = "GL_SAMPLES_PASSED";
	static const glw::GLchar* invalid_target_name = "unknow mode";

	/* Return proper value. */
	if (GL_ANY_SAMPLES_PASSED == mode)
	{
		return any_samples_name;
	}

	if (GL_SAMPLES_PASSED == mode)
	{
		return samples_name;
	}

	/* If not, return invalid name. */
	return invalid_target_name;
}